

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void embree::SceneGraph::optimize_animation(Ref<embree::SceneGraph::Node> *node)

{
  float *pfVar1;
  float *pfVar2;
  Node *pNVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long *plVar12;
  long *plVar13;
  ulong uVar14;
  uint uVar15;
  ulong unaff_RBP;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar3 = node->ptr;
  if (pNVar3 == (Node *)0x0) {
    return;
  }
  plVar12 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&TransformNode::typeinfo,0);
  if (plVar12 != (long *)0x0) {
    (**(code **)(*plVar12 + 0x10))(plVar12);
    pNVar3 = (Node *)plVar12[0x13];
    local_38.ptr = pNVar3;
    if (pNVar3 != (Node *)0x0) {
      (*(pNVar3->super_RefCount)._vptr_RefCount[2])(pNVar3);
    }
    optimize_animation(&local_38);
    if (pNVar3 != (Node *)0x0) {
      (*(pNVar3->super_RefCount)._vptr_RefCount[3])(pNVar3);
    }
    (**(code **)(*plVar12 + 0x18))(plVar12);
    return;
  }
  plVar12 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&GroupNode::typeinfo,0);
  if (plVar12 != (long *)0x0) {
    (**(code **)(*plVar12 + 0x10))(plVar12);
    plVar13 = (long *)plVar12[0xd];
    plVar4 = (long *)plVar12[0xe];
    if (plVar13 != plVar4) {
      do {
        pNVar3 = (Node *)*plVar13;
        local_40.ptr = pNVar3;
        if (pNVar3 != (Node *)0x0) {
          (*(pNVar3->super_RefCount)._vptr_RefCount[2])(pNVar3);
        }
        optimize_animation(&local_40);
        if (pNVar3 != (Node *)0x0) {
          (*(pNVar3->super_RefCount)._vptr_RefCount[3])(pNVar3);
        }
        plVar13 = plVar13 + 1;
      } while (plVar13 != plVar4);
    }
    (**(code **)(*plVar12 + 0x18))(plVar12);
    return;
  }
  plVar12 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
  if (plVar12 != (long *)0x0) {
    (**(code **)(*plVar12 + 0x10))(plVar12);
    lVar5 = plVar12[0xe];
    uVar14 = plVar12[0xf] - lVar5 >> 5;
    if (1 < uVar14) {
      lVar6 = *(long *)(lVar5 + 8);
      bVar16 = 1;
      uVar17 = 1;
      do {
        bVar20 = lVar6 == *(long *)(lVar5 + 8 + uVar17 * 0x20);
        unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),bVar20);
        if (bVar20 && lVar6 != 0) {
          lVar18 = 0;
          lVar19 = lVar6;
          do {
            lVar19 = lVar19 + -1;
            pfVar1 = (float *)(*(long *)(uVar17 * 0x20 + lVar5 + 0x18) + lVar18);
            pfVar2 = (float *)(*(long *)(lVar5 + 0x18) + lVar18);
            auVar7._4_4_ = -(uint)(pfVar1[1] != pfVar2[1]);
            auVar7._0_4_ = -(uint)(*pfVar1 != *pfVar2);
            auVar7._8_4_ = -(uint)(pfVar1[2] != pfVar2[2]);
            auVar7._12_4_ = -(uint)(pfVar1[3] != pfVar2[3]);
            uVar15 = movmskps((int)unaff_RBP,auVar7);
            bVar20 = (uVar15 & 7) == 0;
            unaff_RBP = (ulong)CONCAT31((int3)(uVar15 >> 8),bVar20);
            if (!bVar20) break;
            lVar18 = lVar18 + 0x10;
          } while (lVar19 != 0);
        }
        bVar16 = bVar16 & (byte)unaff_RBP;
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar14);
      if (bVar16 == 0) goto LAB_0014986b;
    }
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              *)(plVar12 + 0xe),1);
LAB_0014986b:
    (**(code **)(*plVar12 + 0x18))(plVar12);
    return;
  }
  plVar12 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
  if (plVar12 != (long *)0x0) {
    (**(code **)(*plVar12 + 0x10))(plVar12);
    lVar5 = plVar12[0xe];
    uVar14 = plVar12[0xf] - lVar5 >> 5;
    if (1 < uVar14) {
      lVar6 = *(long *)(lVar5 + 8);
      bVar16 = 1;
      uVar17 = 1;
      do {
        bVar20 = lVar6 == *(long *)(lVar5 + 8 + uVar17 * 0x20);
        unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),bVar20);
        if (bVar20 && lVar6 != 0) {
          lVar18 = 0;
          lVar19 = lVar6;
          do {
            lVar19 = lVar19 + -1;
            pfVar1 = (float *)(*(long *)(uVar17 * 0x20 + lVar5 + 0x18) + lVar18);
            pfVar2 = (float *)(*(long *)(lVar5 + 0x18) + lVar18);
            auVar8._4_4_ = -(uint)(pfVar1[1] != pfVar2[1]);
            auVar8._0_4_ = -(uint)(*pfVar1 != *pfVar2);
            auVar8._8_4_ = -(uint)(pfVar1[2] != pfVar2[2]);
            auVar8._12_4_ = -(uint)(pfVar1[3] != pfVar2[3]);
            uVar15 = movmskps((int)unaff_RBP,auVar8);
            bVar20 = (uVar15 & 7) == 0;
            unaff_RBP = (ulong)CONCAT31((int3)(uVar15 >> 8),bVar20);
            if (!bVar20) break;
            lVar18 = lVar18 + 0x10;
          } while (lVar19 != 0);
        }
        bVar16 = bVar16 & (byte)unaff_RBP;
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar14);
      if (bVar16 == 0) goto LAB_00149947;
    }
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              *)(plVar12 + 0xe),1);
LAB_00149947:
    (**(code **)(*plVar12 + 0x18))(plVar12);
    return;
  }
  plVar12 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&HairSetNode::typeinfo,0);
  if (plVar12 != (long *)0x0) {
    (**(code **)(*plVar12 + 0x10))(plVar12);
    lVar5 = plVar12[0xf];
    uVar14 = plVar12[0x10] - lVar5 >> 5;
    plVar13 = plVar12;
    if (1 < uVar14) {
      lVar6 = *(long *)(lVar5 + 8);
      bVar16 = 1;
      uVar17 = 1;
      do {
        bVar20 = lVar6 == *(long *)(lVar5 + 8 + uVar17 * 0x20);
        unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),bVar20);
        if (bVar20 && lVar6 != 0) {
          lVar18 = 0;
          lVar19 = lVar6;
          do {
            lVar19 = lVar19 + -1;
            pfVar1 = (float *)(*(long *)(uVar17 * 0x20 + lVar5 + 0x18) + lVar18);
            pfVar2 = (float *)(*(long *)(lVar5 + 0x18) + lVar18);
            auVar9._4_4_ = -(uint)(pfVar1[1] != pfVar2[1]);
            auVar9._0_4_ = -(uint)(*pfVar1 != *pfVar2);
            auVar9._8_4_ = -(uint)(pfVar1[2] != pfVar2[2]);
            auVar9._12_4_ = -(uint)(pfVar1[3] != pfVar2[3]);
            uVar15 = movmskps((int)unaff_RBP,auVar9);
            bVar20 = (uVar15 & 7) == 0;
            unaff_RBP = (ulong)CONCAT31((int3)(uVar15 >> 8),bVar20);
            if (!bVar20) break;
            lVar18 = lVar18 + 0x10;
          } while (lVar19 != 0);
        }
        bVar16 = bVar16 & (byte)unaff_RBP;
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar14);
      if (bVar16 == 0) goto LAB_00149be3;
    }
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              *)(plVar12 + 0xf),1);
    goto LAB_00149be3;
  }
  plVar13 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&PointSetNode::typeinfo,0);
  if (plVar13 == (long *)0x0) {
    plVar13 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&SubdivMeshNode::typeinfo,0);
    if (plVar13 == (long *)0x0) {
      return;
    }
    (**(code **)(*plVar13 + 0x10))(plVar13);
    lVar5 = plVar13[0xe];
    uVar14 = plVar13[0xf] - lVar5 >> 5;
    if (uVar14 < 2) {
LAB_00149bc7:
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                *)(plVar13 + 0xe),1);
    }
    else {
      lVar6 = *(long *)(lVar5 + 8);
      bVar16 = 1;
      uVar17 = 1;
      do {
        bVar20 = lVar6 == *(long *)(lVar5 + 8 + uVar17 * 0x20);
        unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),bVar20);
        if (bVar20 && lVar6 != 0) {
          lVar18 = 0;
          lVar19 = lVar6;
          do {
            lVar19 = lVar19 + -1;
            pfVar1 = (float *)(*(long *)(uVar17 * 0x20 + lVar5 + 0x18) + lVar18);
            pfVar2 = (float *)(*(long *)(lVar5 + 0x18) + lVar18);
            auVar11._4_4_ = -(uint)(pfVar1[1] != pfVar2[1]);
            auVar11._0_4_ = -(uint)(*pfVar1 != *pfVar2);
            auVar11._8_4_ = -(uint)(pfVar1[2] != pfVar2[2]);
            auVar11._12_4_ = -(uint)(pfVar1[3] != pfVar2[3]);
            uVar15 = movmskps((int)unaff_RBP,auVar11);
            bVar20 = (uVar15 & 7) == 0;
            unaff_RBP = (ulong)CONCAT31((int3)(uVar15 >> 8),bVar20);
            if (!bVar20) break;
            lVar18 = lVar18 + 0x10;
          } while (lVar19 != 0);
        }
        bVar16 = bVar16 & (byte)unaff_RBP;
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar14);
      if (bVar16 != 0) goto LAB_00149bc7;
    }
    (**(code **)(*plVar13 + 0x18))();
  }
  else {
    (**(code **)(*plVar13 + 0x10))(plVar13);
    lVar5 = plVar13[0xf];
    uVar14 = plVar13[0x10] - lVar5 >> 5;
    if (uVar14 < 2) {
LAB_00149aeb:
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                *)(plVar13 + 0xf),1);
    }
    else {
      lVar6 = *(long *)(lVar5 + 8);
      bVar16 = 1;
      uVar17 = 1;
      do {
        bVar20 = lVar6 == *(long *)(lVar5 + 8 + uVar17 * 0x20);
        unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),bVar20);
        if (bVar20 && lVar6 != 0) {
          lVar18 = 0;
          lVar19 = lVar6;
          do {
            lVar19 = lVar19 + -1;
            pfVar1 = (float *)(*(long *)(uVar17 * 0x20 + lVar5 + 0x18) + lVar18);
            pfVar2 = (float *)(*(long *)(lVar5 + 0x18) + lVar18);
            auVar10._4_4_ = -(uint)(pfVar1[1] != pfVar2[1]);
            auVar10._0_4_ = -(uint)(*pfVar1 != *pfVar2);
            auVar10._8_4_ = -(uint)(pfVar1[2] != pfVar2[2]);
            auVar10._12_4_ = -(uint)(pfVar1[3] != pfVar2[3]);
            uVar15 = movmskps((int)unaff_RBP,auVar10);
            bVar20 = (uVar15 & 7) == 0;
            unaff_RBP = (ulong)CONCAT31((int3)(uVar15 >> 8),bVar20);
            if (!bVar20) break;
            lVar18 = lVar18 + 0x10;
          } while (lVar19 != 0);
        }
        bVar16 = bVar16 & (byte)unaff_RBP;
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar14);
      if (bVar16 != 0) goto LAB_00149aeb;
    }
    (**(code **)(*plVar13 + 0x18))();
  }
  plVar13 = (long *)0x0;
LAB_00149be3:
  if (plVar12 == (long *)0x0) {
    return;
  }
  (**(code **)(*plVar13 + 0x18))();
  return;
}

Assistant:

void SceneGraph::HairSetNode::print(std::ostream& cout, int depth) {
    cout << "HairSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }